

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void vkt::ssbo::anon_unknown_15::initRefDataStorage
               (ShaderInterface *interface,BufferLayout *layout,RefDataStorage *storage)

{
  int bufferSize;
  pointer puVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer piVar4;
  int iVar5;
  pointer puVar6;
  long lVar7;
  int blockNdx;
  long lVar8;
  long lVar9;
  BlockDataPtr BVar10;
  vector<int,_std::allocator<int>_> bufferSizes;
  
  computeBufferSizes(&bufferSizes,interface,layout);
  iVar5 = 0;
  for (piVar4 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar4 != bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
    iVar5 = iVar5 + *piVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&storage->data,(long)iVar5);
  puVar1 = (storage->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  iVar5 = 0;
  puVar6 = (pointer)0x0;
  if (puVar1 != (storage->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    puVar6 = puVar1;
  }
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::resize
            (&storage->pointers,
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6);
  lVar9 = 8;
  lVar7 = 0;
  for (lVar8 = 0;
      pBVar2 = (layout->blocks).
               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(layout->blocks).
                                  super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 6);
      lVar8 = lVar8 + 1) {
    bufferSize = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
    BVar10 = getBlockDataPtr(layout,(BlockLayoutEntry *)((long)&(pBVar2->name)._M_dataplus + lVar7),
                             puVar6 + iVar5,bufferSize);
    pBVar3 = (storage->pointers).
             super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(void **)((long)pBVar3 + lVar9 + -8) = BVar10.ptr;
    *(long *)((long)&pBVar3->ptr + lVar9) = BVar10._8_8_;
    iVar5 = iVar5 + bufferSize;
    lVar9 = lVar9 + 0x10;
    lVar7 = lVar7 + 0x40;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bufferSizes.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void initRefDataStorage (const ShaderInterface& interface, const BufferLayout& layout, RefDataStorage& storage)
{
	DE_ASSERT(storage.data.empty() && storage.pointers.empty());

	const vector<int>	bufferSizes = computeBufferSizes(interface, layout);
	int					totalSize	= 0;

	for (vector<int>::const_iterator sizeIter = bufferSizes.begin(); sizeIter != bufferSizes.end(); ++sizeIter)
		totalSize += *sizeIter;

	storage.data.resize(totalSize);

	// Pointers for each block.
	{
		deUint8*	basePtr		= storage.data.empty() ? DE_NULL : &storage.data[0];
		int			curOffset	= 0;

		DE_ASSERT(bufferSizes.size() == layout.blocks.size());
		DE_ASSERT(totalSize == 0 || basePtr);

		storage.pointers.resize(layout.blocks.size());

		for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
			const int				bufferSize		= bufferSizes[blockNdx];

			storage.pointers[blockNdx] = getBlockDataPtr(layout, blockLayout, basePtr + curOffset, bufferSize);

			curOffset += bufferSize;
		}
	}
}